

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pig.cpp
# Opt level: O2

bool __thiscall Pig::skipWS(Pig *this)

{
  size_type *i;
  ulong uVar1;
  bool bVar2;
  uint c;
  ulong uVar3;
  
  i = &this->_cursor;
  uVar1 = this->_cursor;
  uVar3 = uVar1;
  do {
    c = utf8_next_char((this->_text).
                       super___shared_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,i);
    if (c == 0) {
      uVar3 = *i;
LAB_00114157:
      return uVar1 < uVar3;
    }
    bVar2 = unicodeWhitespace(c);
    if (!bVar2) {
      *i = uVar3;
      goto LAB_00114157;
    }
    uVar3 = *i;
  } while( true );
}

Assistant:

bool Pig::skipWS ()
{
  auto save = _cursor;

  int c;
  auto prev = _cursor;
  while ((c = utf8_next_char (*_text, _cursor)))
  {
    if (! unicodeWhitespace (c))
    {
      _cursor = prev;
      break;
    }
    prev = _cursor;
  }

  return _cursor > save;
}